

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

strbuf * ssh_cipher_encrypt_length_wrapper(ssh_cipher *c,ptrlen input,unsigned_long seq)

{
  strbuf *psVar1;
  strbuf *sb;
  unsigned_long seq_local;
  ssh_cipher *c_local;
  ptrlen input_local;
  
  if (input.len != 4) {
    fatal_error("ssh_cipher_encrypt_length: needs exactly 4 bytes");
  }
  psVar1 = strbuf_dup(input);
  ssh_cipher_encrypt_length(c,psVar1->u,(int)psVar1->len,seq);
  return psVar1;
}

Assistant:

strbuf *ssh_cipher_encrypt_length_wrapper(ssh_cipher *c, ptrlen input,
                                           unsigned long seq)
{
    if (input.len != 4)
        fatal_error("ssh_cipher_encrypt_length: needs exactly 4 bytes");
    strbuf *sb = strbuf_dup(input);
    ssh_cipher_encrypt_length(c, sb->u, sb->len, seq);
    return sb;
}